

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

uint __thiscall llvm::APInt::countLeadingZerosSlowCase(APInt *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  uVar1 = this->BitWidth;
  uVar6 = (ulong)uVar1 + 0x3f >> 6;
  iVar5 = (int)uVar6 << 6;
  iVar7 = 0;
  while( true ) {
    if ((long)uVar6 < 1) goto LAB_00167934;
    uVar2 = *(ulong *)(((this->U).VAL - 8) + uVar6 * 8);
    if (uVar2 != 0) break;
    iVar7 = iVar7 + 0x40;
    uVar6 = uVar6 - 1;
  }
  lVar3 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  iVar5 = ((uint)lVar3 ^ 0x3f) + iVar7;
LAB_00167934:
  uVar4 = uVar1 | 0xffffffc0;
  if ((uVar1 & 0x3f) == 0) {
    uVar4 = 0;
  }
  return uVar4 + iVar5;
}

Assistant:

unsigned getNumWords() const { return getNumWords(BitWidth); }